

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void ITransformOne(uint8_t *ref,int16_t *in,uint8_t *dst)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int aiStack_58 [4];
  int C [16];
  
  for (lVar1 = 0; (int)lVar1 != 8; lVar1 = lVar1 + 2) {
    iVar3 = (int)*(short *)((long)in + lVar1 + 0x10);
    iVar2 = iVar3 + *(short *)((long)in + lVar1);
    iVar3 = *(short *)((long)in + lVar1) - iVar3;
    iVar4 = (int)*(short *)((long)in + lVar1 + 8);
    iVar6 = (int)*(short *)((long)in + lVar1 + 0x18);
    iVar5 = (iVar4 * 0x8a8c >> 0x10) - (iVar6 * 0x14e7b >> 0x10);
    iVar4 = (iVar6 * 0x8a8c >> 0x10) + (iVar4 * 0x14e7b >> 0x10);
    aiStack_58[lVar1 * 2] = iVar4 + iVar2;
    aiStack_58[lVar1 * 2 + 1] = iVar5 + iVar3;
    aiStack_58[lVar1 * 2 + 2] = iVar3 - iVar5;
    C[lVar1 * 2 + -1] = iVar2 - iVar4;
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
    iVar2 = *(int *)((long)C + lVar1 + 0x10);
    iVar4 = *(int *)((long)aiStack_58 + lVar1) + iVar2 + 4;
    iVar3 = *(int *)((long)C + lVar1 + 0x20);
    iVar6 = (iVar3 * 0x8a8c >> 0x10) + (*(int *)((long)C + lVar1) * 0x14e7b >> 0x10);
    iVar5 = (iVar6 + iVar4 >> 3) + (uint)ref[lVar1 * 8];
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    iVar2 = (*(int *)((long)aiStack_58 + lVar1) + 4) - iVar2;
    iVar3 = (*(int *)((long)C + lVar1) * 0x8a8c >> 0x10) - (iVar3 * 0x14e7b >> 0x10);
    dst[lVar1 * 8] = (uint8_t)iVar5;
    iVar5 = (iVar3 + iVar2 >> 3) + (uint)ref[lVar1 * 8 + 1];
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    dst[lVar1 * 8 + 1] = (uint8_t)iVar5;
    iVar2 = (iVar2 - iVar3 >> 3) + (uint)ref[lVar1 * 8 + 2];
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    if (0xfe < iVar2) {
      iVar2 = 0xff;
    }
    dst[lVar1 * 8 + 2] = (uint8_t)iVar2;
    iVar2 = (iVar4 - iVar6 >> 3) + (uint)ref[lVar1 * 8 + 3];
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    if (0xfe < iVar2) {
      iVar2 = 0xff;
    }
    dst[lVar1 * 8 + 3] = (uint8_t)iVar2;
  }
  return;
}

Assistant:

static WEBP_INLINE void ITransformOne(const uint8_t* ref, const int16_t* in,
                                      uint8_t* dst) {
  int C[4 * 4], *tmp;
  int i;
  tmp = C;
  for (i = 0; i < 4; ++i) {    // vertical pass
    const int a = in[0] + in[8];
    const int b = in[0] - in[8];
    const int c = MUL(in[4], kC2) - MUL(in[12], kC1);
    const int d = MUL(in[4], kC1) + MUL(in[12], kC2);
    tmp[0] = a + d;
    tmp[1] = b + c;
    tmp[2] = b - c;
    tmp[3] = a - d;
    tmp += 4;
    in++;
  }

  tmp = C;
  for (i = 0; i < 4; ++i) {    // horizontal pass
    const int dc = tmp[0] + 4;
    const int a =  dc +  tmp[8];
    const int b =  dc -  tmp[8];
    const int c = MUL(tmp[4], kC2) - MUL(tmp[12], kC1);
    const int d = MUL(tmp[4], kC1) + MUL(tmp[12], kC2);
    STORE(0, i, a + d);
    STORE(1, i, b + c);
    STORE(2, i, b - c);
    STORE(3, i, a - d);
    tmp++;
  }
}